

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  byte bVar5;
  _Bool _Var6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  char *__s;
  char *pcVar10;
  size_t sVar11;
  Cookie *pCVar12;
  char *pcVar13;
  long *__base;
  long *plVar14;
  Cookie *pCVar15;
  Cookie *pCVar16;
  ulong uVar17;
  bool bVar18;
  char *local_48;
  Curl_easy *local_40;
  char *local_38;
  
  local_38 = path;
  sVar8 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar8] != (Cookie *)0x0)) {
    pCVar16 = (Cookie *)(c->cookies + sVar8);
    local_40 = data;
    remove_expired(c);
    _Var4 = Curl_host_is_ipnum(host);
    uVar17 = 0;
    pCVar15 = (Cookie *)0x0;
LAB_00564e17:
    do {
      do {
        pCVar16 = pCVar16->next;
        if (pCVar16 == (Cookie *)0x0) {
          pCVar12 = pCVar15;
          sVar9 = uVar17;
          if (uVar17 == 0) {
            return pCVar15;
          }
          goto LAB_005650ae;
        }
      } while ((byte)(pCVar16->secure ^ 1U | secure) != 1);
      pcVar13 = pCVar16->domain;
      if (pcVar13 != (char *)0x0) {
        bVar5 = pCVar16->tailmatch ^ 1;
        if ((bVar5 & 1) == 0 && !_Var4) {
          sVar9 = strlen(pcVar13);
          _Var6 = cookie_tailmatch(pcVar13,sVar9,host);
          if (_Var6) goto LAB_00564e84;
          bVar5 = pCVar16->tailmatch ^ 1;
        }
        if (((bVar5 & 1) == 0 && !_Var4) ||
           (iVar7 = curl_strequal(host,pCVar16->domain), iVar7 == 0)) goto LAB_00564e17;
      }
LAB_00564e84:
      pcVar13 = pCVar16->spath;
      if ((pcVar13 != (char *)0x0) && (sVar9 = strlen(pcVar13), sVar9 != 1)) {
        __s = (*Curl_cstrdup)(local_38);
        local_48 = __s;
        if (__s == (char *)0x0) goto LAB_00564e17;
        pcVar10 = strchr(__s,0x3f);
        if (pcVar10 != (char *)0x0) {
          *pcVar10 = '\0';
        }
        if ((*__s != '/') && (strstore(&local_48,"/",1), __s = local_48, local_48 == (char *)0x0))
        goto LAB_00564e17;
        sVar11 = strlen(__s);
        if ((sVar11 < sVar9) || (iVar7 = strncmp(pcVar13,__s,sVar9), iVar7 != 0)) {
          (*Curl_cfree)(__s);
          goto LAB_00564e17;
        }
        if (sVar9 == sVar11) {
          (*Curl_cfree)(__s);
        }
        else {
          cVar1 = __s[sVar9];
          (*Curl_cfree)(__s);
          if (cVar1 != '/') goto LAB_00564e17;
        }
      }
      pCVar12 = (Cookie *)(*Curl_ccalloc)(1,0x48);
      if (pCVar12 == (Cookie *)0x0) goto LAB_0056512a;
      if (pCVar16->domain != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pCVar16->domain);
        pCVar12->domain = pcVar13;
        if (pcVar13 != (char *)0x0) goto LAB_00564fc9;
LAB_00565122:
        freecookie(pCVar12);
        goto LAB_0056512a;
      }
LAB_00564fc9:
      if (pCVar16->path != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pCVar16->path);
        pCVar12->path = pcVar13;
        if (pcVar13 == (char *)0x0) goto LAB_00565122;
      }
      if (pCVar16->spath != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pCVar16->spath);
        pCVar12->spath = pcVar13;
        if (pcVar13 == (char *)0x0) goto LAB_00565122;
      }
      if (pCVar16->name != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pCVar16->name);
        pCVar12->name = pcVar13;
        if (pcVar13 == (char *)0x0) goto LAB_00565122;
      }
      if (pCVar16->value != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pCVar16->value);
        pCVar12->value = pcVar13;
        if (pcVar13 == (char *)0x0) goto LAB_00565122;
      }
      pCVar12->expires = pCVar16->expires;
      _Var6 = pCVar16->secure;
      _Var2 = pCVar16->livecookie;
      _Var3 = pCVar16->httponly;
      pCVar12->tailmatch = pCVar16->tailmatch;
      pCVar12->secure = _Var6;
      pCVar12->livecookie = _Var2;
      pCVar12->httponly = _Var3;
      pCVar12->creationtime = pCVar16->creationtime;
      pCVar12->next = pCVar15;
      sVar9 = uVar17 + 1;
      bVar18 = uVar17 < 0x95;
      uVar17 = sVar9;
      pCVar15 = pCVar12;
    } while (bVar18);
    if ((local_40 != (Curl_easy *)0x0) && (((local_40->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(local_40,"Included max number of cookies (%zu) in request!",sVar9);
    }
LAB_005650ae:
    __base = (long *)(*Curl_cmalloc)(sVar9 * 8);
    pCVar15 = pCVar12;
    if (__base != (long *)0x0) {
      sVar11 = 1;
      plVar14 = __base;
      for (; pCVar12 != (Cookie *)0x0; pCVar12 = pCVar12->next) {
        *plVar14 = (long)pCVar12;
        plVar14 = plVar14 + 1;
      }
      qsort(__base,sVar9,8,cookie_sort);
      pCVar16 = (Cookie *)*__base;
      pCVar15 = pCVar16;
      for (; sVar9 != sVar11; sVar11 = sVar11 + 1) {
        pCVar12 = (Cookie *)__base[sVar11];
        pCVar15->next = pCVar12;
        pCVar15 = pCVar12;
      }
      *(undefined8 *)__base[sVar9 - 1] = 0;
      (*Curl_cfree)(__base);
      return pCVar16;
    }
LAB_0056512a:
    Curl_cookie_freelist(pCVar15);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip &&
          cookie_tailmatch(co->domain, strlen(co->domain), host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}